

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise_x86_avx512.cpp
# Opt level: O3

int __thiscall
ncnn::ConvolutionDepthWise_x86_avx512::create_group_ops
          (ConvolutionDepthWise_x86_avx512 *this,Option *opt)

{
  uint *puVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  size_t sVar5;
  Allocator *pAVar6;
  int *piVar7;
  long *plVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  undefined8 uVar22;
  undefined8 uVar23;
  byte bVar24;
  size_t sVar25;
  int i;
  pointer ppLVar26;
  Layer *pLVar27;
  pointer ppLVar28;
  ulong uVar29;
  size_t sVar30;
  int iVar31;
  void *in_R8;
  void *pvVar32;
  long lVar33;
  bool bVar34;
  ushort uVar35;
  undefined1 auVar36 [64];
  undefined1 auVar37 [64];
  undefined1 auVar38 [64];
  undefined1 auVar39 [64];
  undefined1 auVar40 [64];
  undefined1 auVar41 [64];
  ParamDict pd;
  Mat local_288;
  undefined8 local_240;
  int local_234;
  int local_230;
  int local_22c;
  Mat local_228;
  void *local_1e0;
  int *piStack_1d8;
  size_t local_1d0;
  int local_1c8;
  Allocator *local_1c0;
  undefined8 local_1b8;
  ulong uStack_1b0;
  uint local_1a8;
  size_t local_1a0;
  void *local_198;
  int *piStack_190;
  size_t local_188;
  int local_180;
  Allocator *local_178;
  undefined8 local_170;
  ulong uStack_168;
  uint local_160;
  size_t local_158;
  void *local_150;
  int *piStack_148;
  size_t sStack_140;
  int iStack_138;
  Allocator *local_130;
  undefined4 local_128;
  undefined4 uStack_124;
  undefined4 uStack_120;
  undefined4 uStack_11c;
  undefined4 local_118;
  undefined8 local_110;
  void *local_108;
  int *piStack_100;
  size_t sStack_f8;
  int iStack_f0;
  Allocator *local_e8;
  undefined4 local_e0;
  undefined4 uStack_dc;
  undefined4 uStack_d8;
  undefined4 uStack_d4;
  undefined4 local_d0;
  undefined8 local_c8;
  vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *local_c0;
  size_t local_b8;
  Allocator *local_b0;
  Mat local_a8;
  size_t local_60;
  Mat *local_58;
  size_t local_50;
  Option *local_48;
  ParamDict local_40;
  
  iVar2 = (this->super_ConvolutionDepthWise).num_output;
  iVar31 = (this->super_ConvolutionDepthWise).kernel_h * (this->super_ConvolutionDepthWise).kernel_w
  ;
  iVar3 = (this->super_ConvolutionDepthWise).group;
  uVar29 = (long)(this->super_ConvolutionDepthWise).weight_data_size / (long)iVar3;
  uVar29 = (long)((ulong)(uint)((int)uVar29 >> 0x1f) << 0x20 | uVar29 & 0xffffffff) / (long)iVar31;
  ppLVar28 = (this->group_ops).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>.
             _M_impl.super__Vector_impl_data._M_finish;
  ppLVar26 = (this->group_ops).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  local_48 = opt;
  if (0 < (int)((ulong)((long)ppLVar28 - (long)ppLVar26) >> 3)) {
    lVar33 = 0;
    do {
      if (ppLVar26[lVar33] != (Layer *)0x0) {
        (*ppLVar26[lVar33]->_vptr_Layer[1])();
        ppLVar26 = (this->group_ops).
                   super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
                   super__Vector_impl_data._M_start;
        ppLVar28 = (this->group_ops).
                   super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
                   super__Vector_impl_data._M_finish;
      }
      lVar33 = lVar33 + 1;
    } while (lVar33 < (int)((ulong)((long)ppLVar28 - (long)ppLVar26) >> 3));
  }
  local_c0 = &this->group_ops;
  if (ppLVar28 != ppLVar26) {
    (this->group_ops).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppLVar26;
  }
  iVar4 = (this->super_ConvolutionDepthWise).group;
  i = (this->super_ConvolutionDepthWise).num_output / iVar4;
  std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::resize(local_c0,(long)iVar4);
  if (0 < (this->super_ConvolutionDepthWise).group) {
    local_22c = iVar31 * i *
                (((int)((long)((ulong)(uint)((int)uVar29 >> 0x1f) << 0x20 | uVar29 & 0xffffffff) /
                       (long)(iVar2 / iVar3)) * iVar3) / iVar4);
    local_50 = (size_t)local_22c;
    local_60 = (size_t)i;
    local_58 = &(this->super_ConvolutionDepthWise).activation_params;
    sVar30 = 0;
    do {
      local_228.elemsize = (this->super_ConvolutionDepthWise).weight_data.elemsize;
      local_228.data =
           (void *)(sVar30 * local_50 * local_228.elemsize +
                   (long)(this->super_ConvolutionDepthWise).weight_data.data);
      local_228.elempack = (this->super_ConvolutionDepthWise).weight_data.elempack;
      local_228.allocator = (this->super_ConvolutionDepthWise).weight_data.allocator;
      local_228.refcount = (int *)0x0;
      local_228.w = (int)local_50;
      local_228.dims = 1;
      local_228.h = 1;
      local_228.d = 1;
      local_228.c = 1;
      local_228.cstep = local_50;
      Mat::clone(&local_a8,(__fn *)&local_228,(void *)0x0,1,in_R8);
      if (local_228.refcount != (int *)0x0) {
        LOCK();
        *local_228.refcount = *local_228.refcount + -1;
        UNLOCK();
        if (*local_228.refcount == 0) {
          if (local_228.allocator == (Allocator *)0x0) {
            if (local_228.data != (void *)0x0) {
              free(local_228.data);
            }
          }
          else {
            (*(local_228.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      bVar34 = (this->super_ConvolutionDepthWise).bias_term == 0;
      if (bVar34) {
        pvVar32 = (void *)0x0;
        local_240 = 0;
        local_230 = 0;
        local_b0 = (Allocator *)0x0;
        local_234 = 0;
        local_b8 = 0;
      }
      else {
        local_240 = (this->super_ConvolutionDepthWise).bias_data.elemsize;
        pvVar32 = (void *)(sVar30 * local_60 * local_240 +
                          (long)(this->super_ConvolutionDepthWise).bias_data.data);
        local_230 = (this->super_ConvolutionDepthWise).bias_data.elempack;
        local_b0 = (this->super_ConvolutionDepthWise).bias_data.allocator;
        local_b8 = local_60;
        local_234 = i;
      }
      bVar34 = !bVar34;
      pLVar27 = create_layer_cpu(6);
      ParamDict::ParamDict(&local_40);
      ParamDict::set(&local_40,0,i);
      ParamDict::set(&local_40,1,(this->super_ConvolutionDepthWise).kernel_w);
      ParamDict::set(&local_40,0xb,(this->super_ConvolutionDepthWise).kernel_h);
      ParamDict::set(&local_40,2,(this->super_ConvolutionDepthWise).dilation_w);
      ParamDict::set(&local_40,0xc,(this->super_ConvolutionDepthWise).dilation_h);
      ParamDict::set(&local_40,3,(this->super_ConvolutionDepthWise).stride_w);
      ParamDict::set(&local_40,0xd,(this->super_ConvolutionDepthWise).stride_h);
      ParamDict::set(&local_40,4,0);
      ParamDict::set(&local_40,0xe,0);
      ParamDict::set(&local_40,5,(this->super_ConvolutionDepthWise).bias_term);
      ParamDict::set(&local_40,6,local_22c);
      ParamDict::set(&local_40,8,(this->super_ConvolutionDepthWise).int8_scale_term);
      ParamDict::set(&local_40,9,(this->super_ConvolutionDepthWise).activation_type);
      ParamDict::set(&local_40,10,local_58);
      (*pLVar27->_vptr_Layer[2])(pLVar27,&local_40);
      if ((this->super_ConvolutionDepthWise).bias_term == 0) {
        lVar33 = 0x40;
        do {
          *(undefined8 *)((long)&local_228.data + lVar33) = 0;
          *(undefined1 (*) [16])((long)&local_288.allocator + lVar33) = (undefined1  [16])0x0;
          *(undefined1 (*) [16])((long)&local_288.w + lVar33) = (undefined1  [16])0x0;
          *(undefined1 (*) [16])((long)&local_288.cstep + lVar33) = (undefined1  [16])0x0;
          *(undefined1 (*) [16])((long)&local_240 + lVar33 + 4) = (undefined1  [16])0x0;
          lVar33 = lVar33 + 0x48;
        } while (lVar33 != 0x160);
        if (local_a8.refcount != (int *)0x0) {
          LOCK();
          *local_a8.refcount = *local_a8.refcount + 1;
          UNLOCK();
        }
        if (local_228.refcount != (int *)0x0) {
          LOCK();
          *local_228.refcount = *local_228.refcount + -1;
          UNLOCK();
          if (*local_228.refcount == 0) {
            if (local_228.allocator == (Allocator *)0x0) {
              if (local_228.data != (void *)0x0) {
                free(local_228.data);
              }
            }
            else {
              (*(local_228.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        local_228.data = local_a8.data;
        local_228.refcount = local_a8.refcount;
        local_228.elemsize = local_a8.elemsize;
        local_228.elempack = local_a8.elempack;
        local_228.allocator = local_a8.allocator;
        local_228.dims = local_a8.dims;
        local_228.w = local_a8.w;
        local_228.h = local_a8.h;
        local_228.d = local_a8.d;
        local_228.c = local_a8.c;
        local_228.cstep = local_a8.cstep;
        if ((this->super_ConvolutionDepthWise).int8_scale_term != 0) {
          local_288.cstep = 0;
          local_288.data = (void *)0x0;
          local_288.refcount._0_4_ = 0;
          local_288.refcount._4_4_ = 0;
          local_288.elemsize = 0;
          local_288.elempack = 0;
          local_288.h = 0;
          local_288.d = 0;
          local_288.c = 0;
          local_288.allocator = (Allocator *)0x0;
          local_288.dims = 0;
          local_288.w = 0;
          Mat::create(&local_288,i,4,(Allocator *)0x0);
          auVar36 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
          auVar37 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
          if (0 < local_288.c * (int)local_288.cstep) {
            auVar38 = vpbroadcastq_avx512f();
            auVar39 = vbroadcastss_avx512f
                                (ZEXT416(*(uint *)((long)(this->super_ConvolutionDepthWise).
                                                         weight_data_int8_scales.data + sVar30 * 4))
                                );
            uVar29 = 0;
            do {
              auVar40 = vpbroadcastq_avx512f();
              auVar41 = vporq_avx512f(auVar40,auVar36);
              auVar40 = vporq_avx512f(auVar40,auVar37);
              uVar22 = vpcmpuq_avx512f(auVar40,auVar38,2);
              uVar23 = vpcmpuq_avx512f(auVar41,auVar38,2);
              bVar24 = (byte)uVar23;
              uVar35 = CONCAT11(bVar24,(byte)uVar22);
              puVar1 = (uint *)((long)local_288.data + uVar29 * 4);
              bVar34 = (bool)((byte)uVar22 & 1);
              bVar9 = (bool)((byte)(uVar35 >> 1) & 1);
              bVar10 = (bool)((byte)(uVar35 >> 2) & 1);
              bVar11 = (bool)((byte)(uVar35 >> 3) & 1);
              bVar12 = (bool)((byte)(uVar35 >> 4) & 1);
              bVar13 = (bool)((byte)(uVar35 >> 5) & 1);
              bVar14 = (bool)((byte)(uVar35 >> 6) & 1);
              bVar15 = (bool)((byte)(uVar35 >> 7) & 1);
              bVar16 = (bool)(bVar24 >> 1 & 1);
              bVar17 = (bool)(bVar24 >> 2 & 1);
              bVar18 = (bool)(bVar24 >> 3 & 1);
              bVar19 = (bool)(bVar24 >> 4 & 1);
              bVar20 = (bool)(bVar24 >> 5 & 1);
              bVar21 = (bool)(bVar24 >> 6 & 1);
              *puVar1 = (uint)bVar34 * auVar39._0_4_ | (uint)!bVar34 * *puVar1;
              puVar1[1] = (uint)bVar9 * auVar39._4_4_ | (uint)!bVar9 * puVar1[1];
              puVar1[2] = (uint)bVar10 * auVar39._8_4_ | (uint)!bVar10 * puVar1[2];
              puVar1[3] = (uint)bVar11 * auVar39._12_4_ | (uint)!bVar11 * puVar1[3];
              puVar1[4] = (uint)bVar12 * auVar39._16_4_ | (uint)!bVar12 * puVar1[4];
              puVar1[5] = (uint)bVar13 * auVar39._20_4_ | (uint)!bVar13 * puVar1[5];
              puVar1[6] = (uint)bVar14 * auVar39._24_4_ | (uint)!bVar14 * puVar1[6];
              puVar1[7] = (uint)bVar15 * auVar39._28_4_ | (uint)!bVar15 * puVar1[7];
              puVar1[8] = (uint)(bVar24 & 1) * auVar39._32_4_ |
                          (uint)!(bool)(bVar24 & 1) * puVar1[8];
              puVar1[9] = (uint)bVar16 * auVar39._36_4_ | (uint)!bVar16 * puVar1[9];
              puVar1[10] = (uint)bVar17 * auVar39._40_4_ | (uint)!bVar17 * puVar1[10];
              puVar1[0xb] = (uint)bVar18 * auVar39._44_4_ | (uint)!bVar18 * puVar1[0xb];
              puVar1[0xc] = (uint)bVar19 * auVar39._48_4_ | (uint)!bVar19 * puVar1[0xc];
              puVar1[0xd] = (uint)bVar20 * auVar39._52_4_ | (uint)!bVar20 * puVar1[0xd];
              puVar1[0xe] = (uint)bVar21 * auVar39._56_4_ | (uint)!bVar21 * puVar1[0xe];
              puVar1[0xf] = (uint)(bVar24 >> 7) * auVar39._60_4_ |
                            (uint)!(bool)(bVar24 >> 7) * puVar1[0xf];
              uVar29 = uVar29 + 0x10;
            } while ((local_288.c * (int)local_288.cstep + 0xfU & 0xfffffff0) != uVar29);
          }
          piVar7 = (int *)CONCAT44(local_288.refcount._4_4_,local_288.refcount._0_4_);
          if (piVar7 != (int *)0x0) {
            LOCK();
            *piVar7 = *piVar7 + 1;
            UNLOCK();
          }
          if (piStack_1d8 != (int *)0x0) {
            LOCK();
            *piStack_1d8 = *piStack_1d8 + -1;
            UNLOCK();
            if (*piStack_1d8 == 0) {
              if (local_1c0 == (Allocator *)0x0) {
                if (local_1e0 != (void *)0x0) {
                  free(local_1e0);
                }
              }
              else {
                (*local_1c0->_vptr_Allocator[3])();
              }
            }
          }
          piStack_1d8 = (int *)CONCAT44(local_288.refcount._4_4_,local_288.refcount._0_4_);
          local_1e0 = local_288.data;
          local_1d0 = local_288.elemsize;
          local_1c8 = local_288.elempack;
          local_1c0 = local_288.allocator;
          local_1b8 = CONCAT44(local_288.w,local_288.dims);
          uStack_1b0._0_4_ = local_288.h;
          uStack_1b0._4_4_ = local_288.d;
          local_1a8 = local_288.c;
          local_1a0 = local_288.cstep;
          sVar5 = (this->super_ConvolutionDepthWise).bottom_blob_int8_scales.elemsize;
          pvVar32 = (void *)(sVar5 * sVar30 +
                            (long)(this->super_ConvolutionDepthWise).bottom_blob_int8_scales.data);
          iVar2 = (this->super_ConvolutionDepthWise).bottom_blob_int8_scales.elempack;
          pAVar6 = (this->super_ConvolutionDepthWise).bottom_blob_int8_scales.allocator;
          local_240 = sVar30;
          if (piStack_190 != (int *)0x0) {
            LOCK();
            *piStack_190 = *piStack_190 + -1;
            UNLOCK();
            if (*piStack_190 == 0) {
              if (local_178 == (Allocator *)0x0) {
                if (local_198 != (void *)0x0) {
                  free(local_198);
                }
              }
              else {
                (*local_178->_vptr_Allocator[3])();
              }
            }
          }
          sVar25 = local_240;
          piStack_190 = (int *)0x0;
          local_170 = 0x100000001;
          uStack_168 = 0x100000001;
          local_160 = 1;
          local_158 = 1;
          piVar7 = (int *)CONCAT44(local_288.refcount._4_4_,local_288.refcount._0_4_);
          local_198 = pvVar32;
          local_188 = sVar5;
          local_180 = iVar2;
          local_178 = pAVar6;
          if (piVar7 != (int *)0x0) {
            LOCK();
            *piVar7 = *piVar7 + -1;
            UNLOCK();
            if (*piVar7 == 0) {
              if (local_288.allocator == (Allocator *)0x0) {
                if (local_288.data != (void *)0x0) {
                  free(local_288.data);
                }
              }
              else {
                (*(local_288.allocator)->_vptr_Allocator[3])();
              }
            }
          }
          sVar30 = sVar25;
          if (100 < (this->super_ConvolutionDepthWise).int8_scale_term) {
            sVar5 = (this->super_ConvolutionDepthWise).top_blob_int8_scales.elemsize;
            pvVar32 = (this->super_ConvolutionDepthWise).top_blob_int8_scales.data;
            iVar2 = (this->super_ConvolutionDepthWise).top_blob_int8_scales.elempack;
            pAVar6 = (this->super_ConvolutionDepthWise).top_blob_int8_scales.allocator;
            if (piStack_148 != (int *)0x0) {
              LOCK();
              *piStack_148 = *piStack_148 + -1;
              UNLOCK();
              if (*piStack_148 == 0) {
                if (local_130 == (Allocator *)0x0) {
                  if (local_150 != (void *)0x0) {
                    free(local_150);
                  }
                }
                else {
                  (*local_130->_vptr_Allocator[3])();
                }
              }
            }
            piStack_148 = (int *)0x0;
            local_128 = 1;
            uStack_124 = 1;
            uStack_120 = 1;
            uStack_11c = 1;
            local_118 = 1;
            local_110 = 1;
            sVar30 = local_240;
            local_150 = (void *)(sVar5 * sVar25 + (long)pvVar32);
            sStack_140 = sVar5;
            iStack_138 = iVar2;
            local_130 = pAVar6;
          }
        }
        ModelBinFromMatArray::ModelBinFromMatArray((ModelBinFromMatArray *)&local_288,&local_228);
        (*pLVar27->_vptr_Layer[3])(pLVar27,&local_288);
        ModelBinFromMatArray::~ModelBinFromMatArray((ModelBinFromMatArray *)&local_288);
        lVar33 = 0xd8;
        do {
          piVar7 = *(int **)((long)&local_228.refcount + lVar33);
          if (piVar7 != (int *)0x0) {
            LOCK();
            *piVar7 = *piVar7 + -1;
            UNLOCK();
            if (*piVar7 == 0) {
              pvVar32 = *(void **)((long)&local_228.data + lVar33);
              plVar8 = *(long **)((long)&local_228.allocator + lVar33);
              if (plVar8 == (long *)0x0) {
                if (pvVar32 != (void *)0x0) {
                  free(pvVar32);
                }
              }
              else {
                (**(code **)(*plVar8 + 0x18))();
              }
            }
          }
          *(undefined8 *)((long)&local_228.cstep + lVar33) = 0;
          *(undefined1 (*) [16])((long)&local_228.refcount + lVar33 + 4) = (undefined1  [16])0x0;
          *(undefined1 (*) [16])((long)&local_228.data + lVar33) = (undefined1  [16])0x0;
          *(undefined1 (*) [16])((long)&local_228.dims + lVar33) = (undefined1  [16])0x0;
          *(undefined4 *)((long)&local_228.c + lVar33) = 0;
          lVar33 = lVar33 + -0x48;
        } while (lVar33 != -0x48);
      }
      else {
        lVar33 = 0x40;
        do {
          *(undefined8 *)((long)&local_228.data + lVar33) = 0;
          *(undefined1 (*) [16])((long)&local_288.allocator + lVar33) = (undefined1  [16])0x0;
          *(undefined1 (*) [16])((long)&local_288.w + lVar33) = (undefined1  [16])0x0;
          *(undefined1 (*) [16])((long)&local_288.cstep + lVar33) = (undefined1  [16])0x0;
          *(undefined1 (*) [16])((long)&local_240 + lVar33 + 4) = (undefined1  [16])0x0;
          lVar33 = lVar33 + 0x48;
        } while (lVar33 != 0x1a8);
        if (local_a8.refcount != (int *)0x0) {
          LOCK();
          *local_a8.refcount = *local_a8.refcount + 1;
          UNLOCK();
        }
        if (local_228.refcount != (int *)0x0) {
          LOCK();
          *local_228.refcount = *local_228.refcount + -1;
          UNLOCK();
          if (*local_228.refcount == 0) {
            if (local_228.allocator == (Allocator *)0x0) {
              if (local_228.data != (void *)0x0) {
                free(local_228.data);
              }
            }
            else {
              (*(local_228.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        local_228.data = local_a8.data;
        local_228.refcount = local_a8.refcount;
        local_228.elemsize = local_a8.elemsize;
        local_228.elempack = local_a8.elempack;
        local_228.allocator = local_a8.allocator;
        local_228.dims = local_a8.dims;
        local_228.w = local_a8.w;
        local_228.h = local_a8.h;
        local_228.d = local_a8.d;
        local_228.c = local_a8.c;
        local_228.cstep = local_a8.cstep;
        if (piStack_1d8 != (int *)0x0) {
          LOCK();
          *piStack_1d8 = *piStack_1d8 + -1;
          UNLOCK();
          if (*piStack_1d8 == 0) {
            if (local_1c0 == (Allocator *)0x0) {
              if (local_1e0 != (void *)0x0) {
                free(local_1e0);
              }
            }
            else {
              (*local_1c0->_vptr_Allocator[3])();
            }
          }
        }
        piStack_1d8 = (int *)0x0;
        local_1d0 = local_240;
        local_1c8 = local_230;
        local_1c0 = local_b0;
        local_1a8 = (uint)bVar34;
        local_1b8 = CONCAT44(local_234,local_1a8);
        uStack_1b0 = (ulong)CONCAT14(bVar34,local_1a8);
        local_1a0 = local_b8;
        local_1e0 = pvVar32;
        if ((this->super_ConvolutionDepthWise).int8_scale_term != 0) {
          local_288.cstep = 0;
          local_288.data = (void *)0x0;
          local_288.refcount._0_4_ = 0;
          local_288.refcount._4_4_ = 0;
          local_288.elemsize = 0;
          local_288.elempack = 0;
          local_288.h = 0;
          local_288.d = 0;
          local_288.c = 0;
          local_288.allocator = (Allocator *)0x0;
          local_288.dims = 0;
          local_288.w = 0;
          Mat::create(&local_288,i,4,(Allocator *)0x0);
          auVar36 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
          auVar37 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
          if (0 < local_288.c * (int)local_288.cstep) {
            auVar38 = vpbroadcastq_avx512f();
            auVar39 = vbroadcastss_avx512f
                                (ZEXT416(*(uint *)((long)(this->super_ConvolutionDepthWise).
                                                         weight_data_int8_scales.data + sVar30 * 4))
                                );
            uVar29 = 0;
            do {
              auVar40 = vpbroadcastq_avx512f();
              auVar41 = vporq_avx512f(auVar40,auVar36);
              auVar40 = vporq_avx512f(auVar40,auVar37);
              uVar22 = vpcmpuq_avx512f(auVar40,auVar38,2);
              uVar23 = vpcmpuq_avx512f(auVar41,auVar38,2);
              bVar24 = (byte)uVar23;
              uVar35 = CONCAT11(bVar24,(byte)uVar22);
              puVar1 = (uint *)((long)local_288.data + uVar29 * 4);
              bVar34 = (bool)((byte)uVar22 & 1);
              bVar9 = (bool)((byte)(uVar35 >> 1) & 1);
              bVar10 = (bool)((byte)(uVar35 >> 2) & 1);
              bVar11 = (bool)((byte)(uVar35 >> 3) & 1);
              bVar12 = (bool)((byte)(uVar35 >> 4) & 1);
              bVar13 = (bool)((byte)(uVar35 >> 5) & 1);
              bVar14 = (bool)((byte)(uVar35 >> 6) & 1);
              bVar15 = (bool)((byte)(uVar35 >> 7) & 1);
              bVar16 = (bool)(bVar24 >> 1 & 1);
              bVar17 = (bool)(bVar24 >> 2 & 1);
              bVar18 = (bool)(bVar24 >> 3 & 1);
              bVar19 = (bool)(bVar24 >> 4 & 1);
              bVar20 = (bool)(bVar24 >> 5 & 1);
              bVar21 = (bool)(bVar24 >> 6 & 1);
              *puVar1 = (uint)bVar34 * auVar39._0_4_ | (uint)!bVar34 * *puVar1;
              puVar1[1] = (uint)bVar9 * auVar39._4_4_ | (uint)!bVar9 * puVar1[1];
              puVar1[2] = (uint)bVar10 * auVar39._8_4_ | (uint)!bVar10 * puVar1[2];
              puVar1[3] = (uint)bVar11 * auVar39._12_4_ | (uint)!bVar11 * puVar1[3];
              puVar1[4] = (uint)bVar12 * auVar39._16_4_ | (uint)!bVar12 * puVar1[4];
              puVar1[5] = (uint)bVar13 * auVar39._20_4_ | (uint)!bVar13 * puVar1[5];
              puVar1[6] = (uint)bVar14 * auVar39._24_4_ | (uint)!bVar14 * puVar1[6];
              puVar1[7] = (uint)bVar15 * auVar39._28_4_ | (uint)!bVar15 * puVar1[7];
              puVar1[8] = (uint)(bVar24 & 1) * auVar39._32_4_ |
                          (uint)!(bool)(bVar24 & 1) * puVar1[8];
              puVar1[9] = (uint)bVar16 * auVar39._36_4_ | (uint)!bVar16 * puVar1[9];
              puVar1[10] = (uint)bVar17 * auVar39._40_4_ | (uint)!bVar17 * puVar1[10];
              puVar1[0xb] = (uint)bVar18 * auVar39._44_4_ | (uint)!bVar18 * puVar1[0xb];
              puVar1[0xc] = (uint)bVar19 * auVar39._48_4_ | (uint)!bVar19 * puVar1[0xc];
              puVar1[0xd] = (uint)bVar20 * auVar39._52_4_ | (uint)!bVar20 * puVar1[0xd];
              puVar1[0xe] = (uint)bVar21 * auVar39._56_4_ | (uint)!bVar21 * puVar1[0xe];
              puVar1[0xf] = (uint)(bVar24 >> 7) * auVar39._60_4_ |
                            (uint)!(bool)(bVar24 >> 7) * puVar1[0xf];
              uVar29 = uVar29 + 0x10;
            } while ((local_288.c * (int)local_288.cstep + 0xfU & 0xfffffff0) != uVar29);
          }
          piVar7 = (int *)CONCAT44(local_288.refcount._4_4_,local_288.refcount._0_4_);
          if (piVar7 != (int *)0x0) {
            LOCK();
            *piVar7 = *piVar7 + 1;
            UNLOCK();
          }
          if (piStack_190 != (int *)0x0) {
            LOCK();
            *piStack_190 = *piStack_190 + -1;
            UNLOCK();
            if (*piStack_190 == 0) {
              if (local_178 == (Allocator *)0x0) {
                if (local_198 != (void *)0x0) {
                  free(local_198);
                }
              }
              else {
                (*local_178->_vptr_Allocator[3])();
              }
            }
          }
          piStack_190 = (int *)CONCAT44(local_288.refcount._4_4_,local_288.refcount._0_4_);
          local_198 = local_288.data;
          local_188 = local_288.elemsize;
          local_180 = local_288.elempack;
          local_178 = local_288.allocator;
          local_170 = CONCAT44(local_288.w,local_288.dims);
          uStack_168._0_4_ = local_288.h;
          uStack_168._4_4_ = local_288.d;
          local_160 = local_288.c;
          local_158 = local_288.cstep;
          sVar5 = (this->super_ConvolutionDepthWise).bottom_blob_int8_scales.elemsize;
          pvVar32 = (void *)(sVar5 * sVar30 +
                            (long)(this->super_ConvolutionDepthWise).bottom_blob_int8_scales.data);
          iVar2 = (this->super_ConvolutionDepthWise).bottom_blob_int8_scales.elempack;
          pAVar6 = (this->super_ConvolutionDepthWise).bottom_blob_int8_scales.allocator;
          local_240 = sVar30;
          if (piStack_148 != (int *)0x0) {
            LOCK();
            *piStack_148 = *piStack_148 + -1;
            UNLOCK();
            if (*piStack_148 == 0) {
              if (local_130 == (Allocator *)0x0) {
                if (local_150 != (void *)0x0) {
                  free(local_150);
                }
              }
              else {
                (*local_130->_vptr_Allocator[3])();
              }
            }
          }
          sVar25 = local_240;
          piStack_148 = (int *)0x0;
          local_128 = 1;
          uStack_124 = 1;
          uStack_120 = 1;
          uStack_11c = 1;
          local_118 = 1;
          local_110 = 1;
          piVar7 = (int *)CONCAT44(local_288.refcount._4_4_,local_288.refcount._0_4_);
          local_150 = pvVar32;
          sStack_140 = sVar5;
          iStack_138 = iVar2;
          local_130 = pAVar6;
          if (piVar7 != (int *)0x0) {
            LOCK();
            *piVar7 = *piVar7 + -1;
            UNLOCK();
            if (*piVar7 == 0) {
              if (local_288.allocator == (Allocator *)0x0) {
                if (local_288.data != (void *)0x0) {
                  free(local_288.data);
                }
              }
              else {
                (*(local_288.allocator)->_vptr_Allocator[3])();
              }
            }
          }
          sVar30 = sVar25;
          if (100 < (this->super_ConvolutionDepthWise).int8_scale_term) {
            sVar5 = (this->super_ConvolutionDepthWise).top_blob_int8_scales.elemsize;
            pvVar32 = (this->super_ConvolutionDepthWise).top_blob_int8_scales.data;
            iVar2 = (this->super_ConvolutionDepthWise).top_blob_int8_scales.elempack;
            pAVar6 = (this->super_ConvolutionDepthWise).top_blob_int8_scales.allocator;
            if (piStack_100 != (int *)0x0) {
              LOCK();
              *piStack_100 = *piStack_100 + -1;
              UNLOCK();
              if (*piStack_100 == 0) {
                if (local_e8 == (Allocator *)0x0) {
                  if (local_108 != (void *)0x0) {
                    free(local_108);
                  }
                }
                else {
                  (*local_e8->_vptr_Allocator[3])();
                }
              }
            }
            piStack_100 = (int *)0x0;
            local_e0 = 1;
            uStack_dc = 1;
            uStack_d8 = 1;
            uStack_d4 = 1;
            local_d0 = 1;
            local_c8 = 1;
            sVar30 = local_240;
            local_108 = (void *)(sVar5 * sVar25 + (long)pvVar32);
            sStack_f8 = sVar5;
            iStack_f0 = iVar2;
            local_e8 = pAVar6;
          }
        }
        ModelBinFromMatArray::ModelBinFromMatArray((ModelBinFromMatArray *)&local_288,&local_228);
        (*pLVar27->_vptr_Layer[3])(pLVar27,&local_288);
        ModelBinFromMatArray::~ModelBinFromMatArray((ModelBinFromMatArray *)&local_288);
        lVar33 = 0x120;
        do {
          piVar7 = *(int **)((long)&local_228.refcount + lVar33);
          if (piVar7 != (int *)0x0) {
            LOCK();
            *piVar7 = *piVar7 + -1;
            UNLOCK();
            if (*piVar7 == 0) {
              pvVar32 = *(void **)((long)&local_228.data + lVar33);
              plVar8 = *(long **)((long)&local_228.allocator + lVar33);
              if (plVar8 == (long *)0x0) {
                if (pvVar32 != (void *)0x0) {
                  free(pvVar32);
                }
              }
              else {
                (**(code **)(*plVar8 + 0x18))();
              }
            }
          }
          *(undefined8 *)((long)&local_228.cstep + lVar33) = 0;
          *(undefined1 (*) [16])((long)&local_228.refcount + lVar33 + 4) = (undefined1  [16])0x0;
          *(undefined1 (*) [16])((long)&local_228.data + lVar33) = (undefined1  [16])0x0;
          *(undefined1 (*) [16])((long)&local_228.dims + lVar33) = (undefined1  [16])0x0;
          *(undefined4 *)((long)&local_228.c + lVar33) = 0;
          lVar33 = lVar33 + -0x48;
        } while (lVar33 != -0x48);
      }
      (*pLVar27->_vptr_Layer[4])(pLVar27,local_48);
      (local_c0->super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl.
      super__Vector_impl_data._M_start[sVar30] = pLVar27;
      ParamDict::~ParamDict(&local_40);
      if (local_a8.refcount != (int *)0x0) {
        LOCK();
        *local_a8.refcount = *local_a8.refcount + -1;
        UNLOCK();
        if (*local_a8.refcount == 0) {
          if (local_a8.allocator == (Allocator *)0x0) {
            if (local_a8.data != (void *)0x0) {
              free(local_a8.data);
            }
          }
          else {
            (*(local_a8.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      sVar30 = sVar30 + 1;
    } while ((long)sVar30 < (long)(this->super_ConvolutionDepthWise).group);
  }
  return 0;
}

Assistant:

int ConvolutionDepthWise_x86_avx512::create_group_ops(const Option& opt)
{
    // create Convolution op for each group
    const int maxk = kernel_w * kernel_h;
    int channels = (weight_data_size / group) / maxk / (num_output / group) * group;

    for (int i = 0; i < (int)group_ops.size(); i++)
        delete group_ops[i];

    group_ops.clear();

    const int channels_g = channels / group;
    const int num_output_g = num_output / group;

    group_ops.resize(group);

    for (int g = 0; g < group; g++)
    {
        Mat weight_data_g = weight_data.range(maxk * channels_g * num_output_g * g, maxk * channels_g * num_output_g).clone();
        Mat bias_data_g;
        if (bias_term)
            bias_data_g = bias_data.range(num_output_g * g, num_output_g);

        ncnn::Layer* op = ncnn::create_layer_cpu(ncnn::LayerType::Convolution);

        // set param
        ncnn::ParamDict pd;
        pd.set(0, num_output_g); // num_output
        pd.set(1, kernel_w);
        pd.set(11, kernel_h);
        pd.set(2, dilation_w);
        pd.set(12, dilation_h);
        pd.set(3, stride_w);
        pd.set(13, stride_h);
        pd.set(4, 0);  // pad_w
        pd.set(14, 0); // pad_h
        pd.set(5, bias_term);
        pd.set(6, maxk * channels_g * num_output_g); // weight_data_size
        pd.set(8, int8_scale_term);
        pd.set(9, activation_type);
        pd.set(10, activation_params);

        op->load_param(pd);

        // set weights
        if (bias_term)
        {
            ncnn::Mat weights[5];
            weights[0] = weight_data_g;
            weights[1] = bias_data_g;

#if NCNN_INT8
            if (int8_scale_term)
            {
                Mat weight_data_int8_scales_g(num_output_g);
                weight_data_int8_scales_g.fill(weight_data_int8_scales[g]);
                weights[2] = weight_data_int8_scales_g;
                weights[3] = bottom_blob_int8_scales.range(g, 1);
            }
            if (int8_scale_term > 100)
            {
                weights[4] = top_blob_int8_scales.range(g, 1);
            }
#endif

            op->load_model(ModelBinFromMatArray(weights));
        }
        else
        {
            ncnn::Mat weights[4];
            weights[0] = weight_data_g;

#if NCNN_INT8
            if (int8_scale_term)
            {
                Mat weight_data_int8_scales_g(num_output_g);
                weight_data_int8_scales_g.fill(weight_data_int8_scales[g]);
                weights[1] = weight_data_int8_scales_g;
                weights[2] = bottom_blob_int8_scales.range(g, 1);
            }
            if (int8_scale_term > 100)
            {
                weights[3] = top_blob_int8_scales.range(g, 1);
            }
#endif

            op->load_model(ModelBinFromMatArray(weights));
        }

        op->create_pipeline(opt);

        group_ops[g] = op;
    }

    return 0;
}